

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutualInformation.cpp
# Opt level: O3

void __thiscall
MutualInformation::MutualInformation(MutualInformation *this,shared_ptr<Launcher> *launcher)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  (this->super_Application)._listOfFeatures.super__Vector_base<Feature,_std::allocator<Feature>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Application)._listOfFeatures.super__Vector_base<Feature,_std::allocator<Feature>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[1] = 0;
  (this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[1] = 0;
  (this->super_Application)._features.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->super_Application)._features.super__Base_bitset<2UL>._M_w[1] = 0;
  (this->super_Application)._listOfFeatures.super__Vector_base<Feature,_std::allocator<Feature>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__MutualInformation_002d7b90;
  (this->_pathToFiles)._M_dataplus._M_p = (pointer)&(this->_pathToFiles).field_2;
  (this->_pathToFiles)._M_string_length = 0;
  (this->_pathToFiles).field_2._M_local_buf[0] = '\0';
  (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_queryRootIndex = (size_t *)0x0;
  Launcher::getCompiler((launcher->super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  p_Var1 = (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28;
  (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Stack_20;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  Launcher::getTreeDecomposition
            ((launcher->super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  p_Var1 = (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  return;
}

Assistant:

MutualInformation::MutualInformation(shared_ptr<Launcher> launcher)
{
    _compiler = launcher->getCompiler();
    _td = launcher->getTreeDecomposition();
}